

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void print_hex(char *name,uchar *s,int slen)

{
  uint uVar1;
  size_t sVar2;
  uint8_t *out;
  ulong uVar3;
  ulong uVar4;
  
  if (*name != '\0') {
    uVar3 = 0;
    do {
      putchar((int)name[uVar3]);
      uVar3 = uVar3 + 1;
      sVar2 = strlen(name);
    } while (uVar3 < sVar2);
  }
  uVar1 = slen * 2;
  out = (uint8_t *)malloc((long)(int)uVar1);
  u8_to_hex(s,slen,out);
  if (0 < slen) {
    uVar3 = 1;
    if (1 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    uVar4 = 0;
    do {
      putchar((uint)out[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  putchar(10);
  free(out);
  return;
}

Assistant:

void print_hex(const char *name, unsigned char *s, int slen)
{
    for(int i = 0; i < strlen(name); i++)
        printf("%c", name[i]);
    unsigned char *hex = (unsigned char*)malloc(2*slen);
    u8_to_hex(s, slen, hex);
    for(int i = 0; i < 2*slen; i++)
        printf("%c", hex[i]);
    printf("\n");
    free(hex);
}